

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

GaoVectorSet * __thiscall
AlphaVectorPlanning::BackProjectSparse
          (GaoVectorSet *__return_storage_ptr__,AlphaVectorPlanning *this,VectorSet *v)

{
  int iVar1;
  ulong uVar2;
  PlanningUnitDecPOMDPDiscrete *pPVar3;
  ulong uVar4;
  size_t sVar5;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_00;
  E *this_01;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong size1;
  ulong uVar9;
  result_type rVar10;
  allocator<char> local_e9;
  GaoVectorSet *local_e8;
  ulong local_e0;
  VectorSet v1;
  matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  mV;
  vector<int,_std::allocator<int>_> duplicates;
  VectorSet vv;
  
  pPVar3 = this->_m_pu;
  if (pPVar3 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar3 = (this->_m_puShared).px;
  }
  local_e8 = __return_storage_ptr__;
  uVar2 = (**(code **)((long)*(pPVar3->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  pPVar3 = this->_m_pu;
  if (pPVar3 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar3 = (this->_m_puShared).px;
  }
  uVar4 = (**(code **)((long)*(pPVar3->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
  pPVar3 = this->_m_pu;
  if (pPVar3 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar3 = (this->_m_puShared).px;
  }
  sVar5 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar3->super_PlanningUnitMADPDiscrete);
  size1 = (ulong)(uint)v->size1_;
  if (size1 == 0) {
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,
         "AlphaVectorPlanning::BackProjectSparse attempting to backproject empty value function");
    __cxa_throw(this_01,&E::typeinfo,E::~E);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&v1,"BackProjectSparse",(allocator<char> *)&vv);
  TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,(string *)&v1);
  std::__cxx11::string::~string((string *)&v1);
  local_e0 = uVar2;
  vv._0_16_ = boost::detail::multi_array::extent_gen<0UL>::operator[]
                        ((extent_gen<0UL> *)boost::(anonymous_namespace)::extents,uVar2 & 0xffffffff
                        );
  boost::detail::multi_array::extent_gen<1UL>::operator[]
            ((extent_gen<2UL> *)&v1,(extent_gen<1UL> *)&vv,uVar4 & 0xffffffff);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(local_e8,(extent_gen<2UL> *)&v1);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(&v1,size1,sVar5 & 0xffffffff);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(&vv,v);
  GetDuplicateIndices(&duplicates,v);
  uVar2 = local_e0 & 0xffffffff;
  for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
    for (uVar7 = 0; uVar7 != (uVar4 & 0xffffffff); uVar7 = uVar7 + 1) {
      local_e0 = 0;
      for (uVar9 = 0; uVar9 != size1; uVar9 = uVar9 + 1) {
        iVar1 = duplicates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9];
        if ((long)iVar1 == -1) {
          mV.data_.e_ = &vv;
          mV.i_ = uVar9;
          for (uVar6 = 0; uVar6 != (sVar5 & 0xffffffff); uVar6 = uVar6 + 1) {
            rVar10 = boost::numeric::ublas::
                     inner_prod<boost::numeric::ublas::compressed_vector<double,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>>
                               (*(vector_expression<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                                  **)(*(long *)(*(long *)&(this->_m_TsOsForBackup).
                                                                                                                    
                                                  super__Vector_base<std::vector<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>,_std::allocator<std::vector<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                                  super__Vector_base<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>,_std::allocator<std::vector<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + uVar6 * 0x18) +
                                     uVar7 * 8),
                                (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                                 *)&mV);
            v1.data_.data_[v1.size2_ * uVar9 + uVar6] = rVar10;
          }
        }
        else {
          for (uVar6 = 0; (sVar5 & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
            *(double *)((long)v1.data_.data_ + uVar6 * 8 + v1.size2_ * local_e0) =
                 v1.data_.data_[(long)iVar1 * v1.size2_ + uVar6];
          }
        }
        local_e0 = local_e0 + 8;
      }
      this_00 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)operator_new(0x28);
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::matrix(this_00,&v1);
      (local_e8->
      super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
      ).
      super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
      .base_[(local_e8->
             super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
             ).
             super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
             .origin_offset_ +
             (local_e8->
             super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
             ).
             super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
             .stride_list_.elems[0] * uVar8 +
             (local_e8->
             super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
             ).
             super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
             .stride_list_.elems[1] * uVar7] = this_00;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&mV,"BackProjectSparse",&local_e9);
  TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,(string *)&mV);
  std::__cxx11::string::~string((string *)&mV);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&duplicates.super__Vector_base<int,_std::allocator<int>_>);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&vv.data_);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&v1.data_);
  return local_e8;
}

Assistant:

GaoVectorSet AlphaVectorPlanning::BackProjectSparse(const VectorSet &v) const
{
    unsigned int nrA=GetPU()->GetNrJointActions(),
        nrO=GetPU()->GetNrJointObservations(),
        nrS=GetPU()->GetNrStates(),
        nrInV=v.size1();

    if(nrInV==0)
        throw(E("AlphaVectorPlanning::BackProjectSparse attempting to backproject empty value function"));

    StartTimer("BackProjectSparse");
    
    GaoVectorSet G(boost::extents[nrA][nrO]);
    VectorSet v1(nrInV,nrS);
    VectorSet vv=v;
    double x;

#if AlphaVectorPlanning_CheckForDuplicates
    vector<int> duplicates=GetDuplicateIndices(v);
#else
    vector<int> duplicates(nrInV,-1);
#endif
    int dup;

    using namespace boost::numeric::ublas;

    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
        {
#if !AlphaVectorPlanning_UseFastSparseBackup
            matrix_column<const ObservationModelMappingSparse::SparseMatrix>
                mO(*_m_Os[a],o);
#endif
            for(unsigned int k=0;k!=nrInV;k++)
            {
                if(duplicates[k]==-1)
                {
                    const matrix_row<VectorSet> mV(vv,k);

                    for(unsigned int s=0;s!=nrS;s++)
                    {
#if AlphaVectorPlanning_UseFastSparseBackup
                        x=inner_prod(*_m_TsOsForBackup[a][s][o],mV);
#else
                        matrix_row<const TransitionModelMappingSparse::
                            SparseMatrix> mT(*_m_Ts[a],s);
                        x=inner_prod(element_prod(mT,mO),mV);
#endif
                        v1(k,s)=x;
                    }
                }
                else
                {
                    dup=duplicates[k];
                    for(unsigned int s=0;s!=nrS;s++)
                        v1(k,s)=v1(dup,s);
                }
            }
            G[a][o]=new VectorSet(v1);
        }

    StopTimer("BackProjectSparse");

    return(G);
}